

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O0

int __thiscall
sentencepiece::unigram::Model::PopulateNodes::anon_class_8_1_809a3e96::operator()
          (anon_class_8_1_809a3e96 *this,int begin_pos,char *end)

{
  int iVar1;
  char *pcVar2;
  char *in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  int pos;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar1 = in_ESI;
  while( true ) {
    pcVar2 = Lattice::surface((Lattice *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                              (int)((ulong)in_RDI >> 0x20));
    if (in_RDX <= pcVar2) break;
    iVar1 = iVar1 + 1;
  }
  return iVar1 - in_ESI;
}

Assistant:

void Model::PopulateNodes(Lattice *lattice) const {
  auto get_chars_length = [&lattice](int begin_pos, const char *end) {
    int pos = begin_pos;
    while (lattice->surface(pos) < end) ++pos;
    return pos - begin_pos;
  };

  const float unk_score = min_score() - kUnkPenalty;

  const int len = lattice->size();
  const char *end = lattice->sentence() + lattice->utf8_size();

  // +1 just in case.
  std::vector<Darts::DoubleArray::result_pair_type> trie_results(
      trie_results_size_ + 1);

  for (int begin_pos = 0; begin_pos < len; ++begin_pos) {
    const char *begin = lattice->surface(begin_pos);

    // Finds all pieces which are prefix of surface(begin_pos).
    const size_t num_nodes = trie_->commonPrefixSearch(
        begin, trie_results.data(), trie_results.size(),
        static_cast<int>(end - begin));
    CHECK_LT(num_nodes, trie_results.size());

    bool has_single_node = false;

    // Inserts pieces to the lattice.
    for (size_t k = 0; k < num_nodes; ++k) {
      const int length =
          get_chars_length(begin_pos, begin + trie_results[k].length);
      const int id = trie_results[k].value;
      if (IsUnusedInlined(id)) continue;
      Lattice::Node *node = lattice->Insert(begin_pos, length);
      node->id = id;  // the value of Trie stores vocab_id.
      // User defined symbol receives extra bonus to always be selected.
      node->score = IsUserDefinedInlined(id) ? (length * max_score_ - 0.1)
                                             : GetScoreInlined(id);
      if (!has_single_node && node->length == 1) {
        has_single_node = true;
      }
    }

    if (!has_single_node) {
      Lattice::Node *node = lattice->Insert(begin_pos, 1);
      node->id = unk_id_;  // add UNK node.
      node->score = unk_score;
    }
  }
}